

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vec3f * barycentric(vec3f *__return_storage_ptr__,vec3i A,vec3i B,vec3i C,vec3i P)

{
  int iVar1;
  int iVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vec3f s [2];
  undefined8 local_20;
  int local_18;
  undefined8 local_10;
  int local_8;
  
  local_10 = A._0_8_;
  local_8 = A.z;
  local_20 = B._0_8_;
  local_18 = B.z;
  s[1].y = 0.0;
  s[1].z = 0.0;
  s[0].z = 0.0;
  s[1].x = 0.0;
  s[0].x = 0.0;
  s[0].y = 0.0;
  lVar4 = 0x18;
  do {
    lVar5 = (ulong)(lVar4 != 0x18) * 4 + 4;
    if (lVar4 == 0) {
      lVar5 = 0;
    }
    iVar1 = *(int *)((long)&local_10 + lVar5);
    *(double *)((long)&s[0].x + lVar4) = (double)(*(int *)((long)&C.x + lVar5) - iVar1);
    iVar2 = *(int *)((long)&P.x + lVar5);
    *(double *)((long)&s[0].y + lVar4) = (double)(*(int *)((long)&local_20 + lVar5) - iVar1);
    *(double *)((long)&s[0].z + lVar4) = (double)(iVar1 - iVar2);
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  dVar7 = s[0].x * s[1].y - s[1].x * s[0].y;
  if (ABS(dVar7) <= 0.01) {
    dVar8 = -1.0;
    dVar6 = 1.0;
    dVar7 = dVar6;
  }
  else {
    dVar3 = s[1].x * s[0].z - s[0].x * s[1].z;
    dVar6 = s[0].y * s[1].z - s[1].y * s[0].z;
    dVar8 = 1.0 - (dVar6 + dVar3) / dVar7;
    dVar6 = dVar6 / dVar7;
    dVar7 = dVar3 / dVar7;
  }
  __return_storage_ptr__->x = dVar8;
  __return_storage_ptr__->y = dVar7;
  __return_storage_ptr__->z = dVar6;
  return __return_storage_ptr__;
}

Assistant:

vec3f barycentric(vec3i A, vec3i B, vec3i C, vec3i P)
{
    vec3f s[2];
    for (int i = 2; i--;) {
        s[i][0] = static_cast<double>(C[i] - A[i]);
        s[i][1] = static_cast<double>(B[i] - A[i]);
        s[i][2] = static_cast<double>(A[i] - P[i]);
    }
    vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) >
        1e-2)  // dont forget that u[2] is integer. If it is zero then triangle ABC is degenerate
        return vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return vec3f(-1, 1, 1);  // in this case generate negative coordinates, it will be thrown away
                             // by the rasterizer
}